

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye.cpp
# Opt level: O1

bool loadEmptyVertexArray(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  
  fwrite("Loading {Empty-VertexArray}\n",0x1c,1,_stdout);
  fflush(_stdout);
  GVar1 = (*glad_glIsVertexArray)(g_gl.vertexArrays[0]);
  if (GVar1 != '\0') {
    (*glad_glDeleteVertexArrays)(1,g_gl.vertexArrays);
  }
  (*glad_glGenVertexArrays)(1,g_gl.vertexArrays);
  (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
  (*glad_glBindVertexArray)(0);
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadEmptyVertexArray()
{
    LOG("Loading {Empty-VertexArray}\n");
    if (glIsVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]))
        glDeleteVertexArrays(1, &g_gl.vertexArrays[VERTEXARRAY_EMPTY]);

    glGenVertexArrays(1, &g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
    glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
    glBindVertexArray(0);

    return (glGetError() == GL_NO_ERROR);
}